

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O1

void vector_int(void)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> s;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  vector<int,_std::allocator<int>_> local_1b8;
  Assert local_1a0;
  undefined8 local_190;
  undefined8 uStack_188;
  ostream local_180 [112];
  ios_base local_110 [264];
  
  local_190 = 0x100000000;
  uStack_188 = 0x9c00000002;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_190;
  std::vector<int,_std::allocator<int>_>::vector(&local_1b8,__l,(allocator_type *)&local_1d8);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_190);
  UnitTests::stream_any_details::output_range_or_type<std::vector<int,std::allocator<int>>>
            (local_180,&local_1b8,(true_type *)&local_1d8);
  local_1a0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1a0.m_line = 0x62;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[15],std::__cxx11::string>
            (&local_1a0,(char (*) [15])"[0, 1, 2, 156]",&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_190);
  std::ios_base::~ios_base(local_110);
  if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(vector_int)
{
    auto s  = std::vector<int>{0, 1, 2, 156};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0, 1, 2, 156]", ss.str());
}